

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake.cpp
# Opt level: O1

QStringList * __thiscall
UnixMakefileGenerator::findDependencies(UnixMakefileGenerator *this,QString *f)

{
  QMakeProject *pQVar1;
  QString *pQVar2;
  undefined8 uVar3;
  Data *pDVar4;
  qsizetype qVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  QStringList *this_00;
  ProStringList *pPVar11;
  iterator sub;
  iterator iVar12;
  QList<ProString> *pQVar13;
  iterator other;
  iterator iVar14;
  iterator this_01;
  iterator iVar15;
  ProString *pPVar16;
  uint uVar17;
  long lVar18;
  ProString *arch_1;
  ProString *pPVar19;
  ProString *arch;
  long in_FS_OFFSET;
  QByteArrayView QVar20;
  QLatin1String QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QLatin1String QVar24;
  QStringView config;
  QStringView config_00;
  QStringView QVar25;
  ProString extensionSuffix;
  ProString language;
  ProString file;
  QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&> local_210;
  QArrayDataPointer<ProString> local_1f8;
  undefined1 local_1d8 [32];
  undefined1 *puStack_1b8;
  undefined1 *local_1b0;
  undefined1 local_1a8 [32];
  undefined1 *local_188;
  undefined1 *puStack_180;
  undefined1 local_178 [40];
  undefined1 *puStack_150;
  ProKey local_138;
  QString local_108;
  ProString local_e8;
  QString local_b8;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  ProKey local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = MakefileGenerator::findDependencies(&this->super_MakefileGenerator,f);
  iVar10 = (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
             [0x21])(this);
  if ((char)iVar10 == '\0') {
    bVar8 = false;
  }
  else {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey(&local_68,"PRECOMPILED_HEADER");
    bVar8 = QMakeProject::isEmpty(pQVar1,&local_68);
    bVar8 = !bVar8;
    if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (bVar8) {
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ProString::ProString((ProString *)local_98,f);
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = (char16_t *)0x0;
    local_b8.d.size = 0;
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_178,"PRECOMPILED_DIR");
    bVar8 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_178);
    if ((QArrayData *)local_178._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
      }
    }
    if (!bVar8) {
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_e8,"PRECOMPILED_DIR");
      QMakeEvaluator::first
                ((ProString *)local_178,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_e8);
      ProString::toQString((QString *)&local_138,(ProString *)local_178);
      pcVar7 = local_b8.d.ptr;
      pDVar6 = local_b8.d.d;
      qVar5 = local_138.super_ProString.m_string.d.size;
      pDVar4 = local_138.super_ProString.m_string.d.d;
      local_138.super_ProString.m_string.d.d = local_b8.d.d;
      local_b8.d.d = pDVar4;
      local_b8.d.ptr = local_138.super_ProString.m_string.d.ptr;
      local_138.super_ProString.m_string.d.ptr = pcVar7;
      local_138.super_ProString.m_string.d.size = local_b8.d.size;
      local_b8.d.size = qVar5;
      if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_178._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
        }
      }
      if (&(local_e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_e8,"QMAKE_ORIG_TARGET");
    QMakeEvaluator::first((ProString *)local_178,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_e8);
    ProString::toQString((QString *)&local_138,(ProString *)local_178);
    QString::append((QString *)&local_b8);
    if (&(local_138.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_138.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_178._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
      }
    }
    if (&(local_e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_e8,"QMAKE_PCH_OUTPUT_EXT");
    QMakeEvaluator::first((ProString *)local_178,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_e8);
    ProString::toQString((QString *)&local_138,(ProString *)local_178);
    QString::append((QString *)&local_b8);
    if (&(local_138.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_138.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_178._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
      }
    }
    if (&(local_e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar1 = (this->super_MakefileGenerator).project;
    QVar20.m_data = (storage_type *)0xd;
    QVar20.m_size = (qsizetype)local_178;
    QString::fromUtf8(QVar20);
    uVar3 = local_178._0_8_;
    config.m_data = (storage_type_conflict *)local_178._8_8_;
    config.m_size = local_178._16_8_;
    bVar8 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
    if ((QArrayData *)uVar3 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar3,2,0x10);
      }
    }
    if (bVar8) {
      local_e8.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_178,"QMAKE_PCH_ARCHS");
      pPVar11 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_178);
      local_e8.m_string.d.d = (Data *)(pPVar11->super_QList<ProString>).d.d;
      local_e8.m_string.d.ptr = (char16_t *)(pPVar11->super_QList<ProString>).d.ptr;
      local_e8.m_string.d.size = (pPVar11->super_QList<ProString>).d.size;
      if ((QArrayData *)local_e8.m_string.d.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_e8.m_string.d.d)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_e8.m_string.d.d)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if ((QArrayData *)local_178._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
        }
      }
      if (local_e8.m_string.d.size == 0) {
        ProString::ProString((ProString *)local_178);
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                  ((QMovableArrayOps<ProString> *)&local_e8,local_e8.m_string.d.size,
                   (ProString *)local_178);
        QList<ProString>::end((QList<ProString> *)&local_e8);
        if ((QArrayData *)local_178._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
          }
        }
      }
      if (local_e8.m_string.d.size != 0) {
        pPVar16 = (ProString *)((long)local_e8.m_string.d.ptr + local_e8.m_string.d.size * 0x30);
        pPVar19 = (ProString *)local_e8.m_string.d.ptr;
        do {
          local_178._0_8_ = local_b8.d.d;
          local_178._8_8_ = local_b8.d.ptr;
          local_178._16_8_ = local_b8.d.size;
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if (pPVar19->m_length != 0) {
            ProString::toQString((QString *)&local_138,pPVar19);
            QVar21.m_data = (char *)0x11;
            QVar21.m_size = (qsizetype)local_178;
            QString::replace(QVar21,(QString *)"${QMAKE_PCH_ARCH}",(CaseSensitivity)&local_138);
            if (&(local_138.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_138.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((local_138.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_138.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(local_138.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          for (sub = QList<QString>::begin(&Option::cpp_ext);
              iVar12 = QList<QString>::end(&Option::cpp_ext), sub.i != iVar12.i; sub.i = sub.i + 1)
          {
            bVar8 = ProString::endsWith((ProString *)local_98,sub.i,CaseSensitive);
            if (bVar8) {
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)this_00,(this_00->d).size,(QString *)local_178
                        );
              QList<QString>::end(this_00);
              break;
            }
          }
          if ((QArrayData *)local_178._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
            }
          }
          pPVar19 = pPVar19 + 1;
        } while (pPVar19 != pPVar16);
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_e8);
    }
    else {
      local_108.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_108.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_108.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = (this->super_MakefileGenerator).project;
      QVar22.m_data = (storage_type *)0xf;
      QVar22.m_size = (qsizetype)local_178;
      QString::fromUtf8(QVar22);
      uVar3 = local_178._0_8_;
      config_00.m_data = (storage_type_conflict *)local_178._8_8_;
      config_00.m_size = local_178._16_8_;
      bVar8 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_00,false);
      if (bVar8) {
        pQVar1 = (this->super_MakefileGenerator).project;
        ProKey::ProKey(&local_138,"QMAKE_PCH_OUTPUT_EXT");
        QMakeEvaluator::first(&local_e8,&pQVar1->super_QMakeEvaluator,&local_138);
        ProString::toQString(&local_108,&local_e8);
        if (&(local_e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_138.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_138.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_138.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_138.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_138.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        QVar23.m_data = (storage_type *)0x0;
        QVar23.m_size = (qsizetype)local_178;
        QString::fromUtf8(QVar23);
        local_108.d.d = (Data *)local_178._0_8_;
        local_108.d.ptr = (char16_t *)local_178._8_8_;
        local_108.d.size = local_178._16_8_;
      }
      if ((QArrayData *)uVar3 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar3,2,0x10);
        }
      }
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_1d8,"QMAKE_PRECOMP_PREFIX");
      QMakeEvaluator::first
                ((ProString *)local_1a8,&pQVar1->super_QMakeEvaluator,(ProKey *)local_1d8);
      local_178._0_8_ = &Option::dir_sep;
      ProString::ProString((ProString *)(local_178 + 8),(ProString *)local_1a8);
      ::operator+=(&local_b8,(QStringBuilder<QString_&,_ProString> *)local_178);
      if ((QArrayData *)local_178._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_178._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_178._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_178._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_178._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_1d8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_1d8._0_8_,2,0x10);
        }
      }
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_178,"QMAKE_BUILTIN_COMPILERS");
      pQVar13 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_178)->
                 super_QList<ProString>;
      if ((QArrayData *)local_178._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
        }
      }
      other = QList<ProString>::begin(pQVar13);
      iVar14 = QList<ProString>::end(pQVar13);
      if (other.i != iVar14.i) {
        do {
          pQVar1 = (this->super_MakefileGenerator).project;
          local_1a8._0_8_ = "QMAKE_";
          local_1a8._16_8_ = "FLAGS_PRECOMPILE";
          local_1a8._8_8_ = other.i;
          ProString::ProString<QStringBuilder<char_const(&)[7],ProString_const&>,char_const(&)[17]>
                    ((ProString *)local_178,
                     (QStringBuilder<QStringBuilder<const_char_(&)[7],_const_ProString_&>,_const_char_(&)[17]>
                      *)local_1a8);
          bVar8 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_178);
          if ((QArrayData *)local_178._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
            }
          }
          uVar17 = 0;
          if (!bVar8) {
            local_178._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
            puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
            local_178._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_178._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_178._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_178._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            pQVar1 = (this->super_MakefileGenerator).project;
            local_1d8._0_8_ = anon_var_dwarf_2c3199;
            local_1d8._8_8_ = other.i;
            ProString::ProString<char_const(&)[16],ProString_const&>
                      ((ProString *)local_1a8,
                       (QStringBuilder<const_char_(&)[16],_const_ProString_&> *)local_1d8);
            QMakeEvaluator::first
                      ((ProString *)local_178,&pQVar1->super_QMakeEvaluator,(ProKey *)local_1a8);
            if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
              }
            }
            if (local_178._28_4_ == 0) {
              uVar17 = 0;
            }
            else {
              local_188 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_180 = &DAT_aaaaaaaaaaaaaaaa;
              local_1a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_1a8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_1a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_1a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              ProString::ProString((ProString *)local_1a8,other.i);
              bVar8 = ProString::operator==((ProString *)local_1a8,"CXX");
              if (bVar8) {
                ProString::ProString((ProString *)local_1d8,"CPP");
                QString::operator=((QString *)local_1a8,(QString *)local_1d8);
                puStack_180 = local_1b0;
                local_1a8._24_8_ = local_1d8._24_8_;
                local_188 = puStack_1b8;
                if ((QArrayData *)local_1d8._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_1d8._0_8_,2,0x10);
                  }
                }
              }
              pQVar1 = (this->super_MakefileGenerator).project;
              local_1f8.d = (Data *)0x2a8a56;
              local_1f8.ptr = (ProString *)local_1a8;
              ProString::ProString<char_const(&)[11],ProString&>
                        ((ProString *)local_1d8,
                         (QStringBuilder<const_char_(&)[11],_ProString_&> *)&local_1f8);
              pQVar13 = &QMakeEvaluator::valuesRef
                                   (&pQVar1->super_QMakeEvaluator,(ProKey *)local_1d8)->
                         super_QList<ProString>;
              if ((QArrayData *)local_1d8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_1d8._0_8_,2,0x10);
                }
              }
              this_01 = QList<ProString>::begin(pQVar13);
              iVar15 = QList<ProString>::end(pQVar13);
              for (; this_01.i != iVar15.i; this_01.i = this_01.i + 1) {
                ProString::toQString((QString *)local_1d8,this_01.i);
                bVar8 = ProString::endsWith((ProString *)local_98,(QString *)local_1d8,CaseSensitive
                                           );
                if ((QArrayData *)local_1d8._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_1d8._0_8_,2,0x10);
                  }
                }
                uVar17 = 10;
                if (bVar8) {
                  local_1f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_1f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_1f8.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
                  pQVar1 = (this->super_MakefileGenerator).project;
                  ProKey::ProKey((ProKey *)local_1d8,"QMAKE_PCH_ARCHS");
                  pPVar11 = QMakeEvaluator::valuesRef
                                      (&pQVar1->super_QMakeEvaluator,(ProKey *)local_1d8);
                  local_1f8.d = (pPVar11->super_QList<ProString>).d.d;
                  local_1f8.ptr = (pPVar11->super_QList<ProString>).d.ptr;
                  local_1f8.size = (pPVar11->super_QList<ProString>).d.size;
                  if (local_1f8.d != (Data *)0x0) {
                    LOCK();
                    ((local_1f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_1f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + 1;
                    UNLOCK();
                  }
                  if ((QArrayData *)local_1d8._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_1d8._0_8_,2,0x10);
                    }
                  }
                  if (local_1f8.size == 0) {
                    ProString::ProString((ProString *)local_1d8);
                    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                              ((QMovableArrayOps<ProString> *)&local_1f8,local_1f8.size,
                               (ProString *)local_1d8);
                    QList<ProString>::end((QList<ProString> *)&local_1f8);
                    if ((QArrayData *)local_1d8._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_1d8._0_8_,2,0x10);
                      }
                    }
                  }
                  if (local_1f8.size != 0) {
                    lVar18 = local_1f8.size * 0x30;
                    pPVar19 = local_1f8.ptr;
                    do {
                      local_1d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_1d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_1d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_210.a.a = &local_b8;
                      local_210.a.b = (ProString *)local_178;
                      local_210.b = &local_108;
                      QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&>::
                      convertTo<QString>((QString *)local_1d8,&local_210);
                      if (pPVar19->m_length != 0) {
                        ProString::toQString((QString *)&local_210,pPVar19);
                        QVar24.m_data = (char *)0x11;
                        QVar24.m_size = (qsizetype)local_1d8;
                        QString::replace(QVar24,(QString *)"${QMAKE_PCH_ARCH}",
                                         (CaseSensitivity)&local_210);
                        pQVar2 = local_210.a.a;
                        if ((QArrayData *)local_210.a.a != (QArrayData *)0x0) {
                          LOCK();
                          *(int *)&((local_210.a.a)->d).d = *(int *)&((local_210.a.a)->d).d + -1;
                          UNLOCK();
                          if (*(int *)&(pQVar2->d).d == 0) {
                            QArrayData::deallocate((QArrayData *)local_210.a.a,2,0x10);
                          }
                        }
                      }
                      QVar25.m_data = (storage_type_conflict *)local_1d8._8_8_;
                      QVar25.m_size = local_1d8._16_8_;
                      cVar9 = QtPrivate::QStringList_contains((QList *)this_00,QVar25,CaseSensitive)
                      ;
                      if (cVar9 == '\0') {
                        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                                  ((QMovableArrayOps<QString> *)this_00,(this_00->d).size,
                                   (QString *)local_1d8);
                        QList<QString>::end(this_00);
                      }
                      if ((QArrayData *)local_1d8._0_8_ != (QArrayData *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i = (((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((((QBasicAtomicInt *)local_1d8._0_8_)->_q_value).
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate((QArrayData *)local_1d8._0_8_,2,0x10);
                        }
                      }
                      pPVar19 = pPVar19 + 1;
                      lVar18 = lVar18 + -0x30;
                    } while (lVar18 != 0);
                  }
                  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_1f8);
                  uVar17 = 0xd;
                }
                if (bVar8) goto LAB_001ad467;
              }
              uVar17 = 9;
LAB_001ad467:
              if (uVar17 == 9) {
                uVar17 = 0;
              }
              if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
                }
              }
            }
            if ((QArrayData *)local_178._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
              }
            }
          }
        } while (((uVar17 & 7) == 0) && (other.i = other.i + 1, other.i != iVar14.i));
      }
      if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QStringList
&UnixMakefileGenerator::findDependencies(const QString &f)
{
    QStringList &ret = MakefileGenerator::findDependencies(f);
    if (doPrecompiledHeaders() && !project->isEmpty("PRECOMPILED_HEADER")) {
        ProString file = f;
        QString header_prefix;
        if(!project->isEmpty("PRECOMPILED_DIR"))
            header_prefix = project->first("PRECOMPILED_DIR").toQString();
        header_prefix += project->first("QMAKE_ORIG_TARGET").toQString();
        header_prefix += project->first("QMAKE_PCH_OUTPUT_EXT").toQString();
        if (project->isActiveConfig("icc_pch_style")) {
            // icc style
            ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
            if (pchArchs.isEmpty())
                pchArchs << ProString(); // normal single-arch PCH
            for (const ProString &arch : std::as_const(pchArchs)) {
                auto pfx = header_prefix;
                if (!arch.isEmpty())
                    pfx.replace(QLatin1String("${QMAKE_PCH_ARCH}"), arch.toQString());
                for (QStringList::Iterator it = Option::cpp_ext.begin();
                    it != Option::cpp_ext.end(); ++it) {
                    if (file.endsWith(*it)) {
                        ret += pfx;
                        break;
                    }
                }
            }
        } else {
            // gcc style (including clang_pch_style)
            QString header_suffix = project->isActiveConfig("clang_pch_style")
                    ? project->first("QMAKE_PCH_OUTPUT_EXT").toQString() : "";
            header_prefix += Option::dir_sep + project->first("QMAKE_PRECOMP_PREFIX");

            for (const ProString &compiler : project->values("QMAKE_BUILTIN_COMPILERS")) {
                if (project->isEmpty(ProKey("QMAKE_" + compiler + "FLAGS_PRECOMPILE")))
                    continue;

                ProString language = project->first(ProKey("QMAKE_LANGUAGE_" + compiler));
                if (language.isEmpty())
                    continue;

                // Unfortunately we were not consistent about the C++ naming
                ProString extensionSuffix = compiler;
                if (extensionSuffix == "CXX")
                    extensionSuffix = ProString("CPP");

                for (const ProString &extension : project->values(ProKey("QMAKE_EXT_" + extensionSuffix))) {
                    if (!file.endsWith(extension.toQString()))
                        continue;

                    ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
                    if (pchArchs.isEmpty())
                        pchArchs << ProString(); // normal single-arch PCH
                    for (const ProString &arch : std::as_const(pchArchs)) {
                        QString precompiledHeader = header_prefix + language + header_suffix;
                        if (!arch.isEmpty()) {
                            precompiledHeader.replace(QLatin1String("${QMAKE_PCH_ARCH}"),
                                                      arch.toQString());
                        }
                        if (!ret.contains(precompiledHeader))
                            ret += precompiledHeader;
                    }

                    goto foundPrecompiledDependency;
                }
            }
          foundPrecompiledDependency:
            ; // Hurray!!
        }
    }
    return ret;
}